

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

void __thiscall
wallet::coinselector_tests::ApproximateBestSubset::test_method(ApproximateBestSubset *this)

{
  undefined1 *puVar1;
  lazy_ostream *assertion_descr;
  long lVar2;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar3;
  int iVar4;
  FastRandomContext *rng;
  iterator pvVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar7;
  int in_stack_fffffffffffffd58;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined8 local_280;
  undefined1 local_278 [16];
  char *local_268;
  undefined1 *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 local_220 [16];
  char *local_210 [2];
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  undefined1 local_1f8 [8];
  assertion_result local_1f0;
  undefined8 local_1d8;
  undefined1 local_1d0 [16];
  auto_space_type local_1c0;
  char *local_1a8;
  ArgsManager *local_1a0;
  assertion_result local_198;
  optional<wallet::SelectionResult> result;
  CoinsResult available_coins;
  FastRandomContext rand;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rand,false);
  puVar1 = (undefined1 *)
           ((long)&result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
                   super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                   super__Optional_payload_base<wallet::SelectionResult>._M_payload + 0x10);
  result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"");
  NewWallet((NodeContext *)&wallet,
            (string *)
            &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node);
  if ((undefined1 *)
      result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ != puVar1) {
    operator_delete((void *)result.super__Optional_base<wallet::SelectionResult,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
                            super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_,
                    (ulong)((long)&(result.
                                    super__Optional_base<wallet::SelectionResult,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>
                                    .super__Optional_payload_base<wallet::SelectionResult>.
                                    _M_payload._M_value.m_selected_inputs._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
  }
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  iVar4 = 1000;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000000;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result,
             (CFeeRate)0x0,0x90,false,0,false,in_stack_fffffffffffffd58);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 300000000;
  pvVar5 = (iterator)0x0;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result,
           (CFeeRate)0x0,0x90,false,0,false,in_stack_fffffffffffffd58);
  groups = KnapsackGroupOutputs
                     (&available_coins,
                      (CWallet *)
                      wallet._M_t.
                      super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                      .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                      (CoinEligibilityFilter *)filter_standard);
  local_1d0._8_8_ =
       (__uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>)
       0x175a588b00;
  rng = &rand;
  KnapsackSolver(&result,groups,(CAmount *)(local_1d0 + 8),1000000,rng);
  local_210[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_210[1] = "";
  local_220._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_220._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x7b7152;
  file.m_end = (iterator)0x331;
  file.m_begin = (iterator)local_210;
  msg.m_end = pvVar5;
  msg.m_begin = (iterator)rng;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)local_220,msg);
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
       super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0.data_ = (pointer)((long)local_278 + 8);
  local_278._8_8_ = "result";
  local_268 = "";
  assertion_descr = (lazy_ostream *)(local_1d0 + 8);
  local_1c0._0_1_ = 0;
  local_1d0._8_8_ = &PTR__lazy_ostream_013abc70;
  local_1c0.n_ = (size_type)boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_228 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,assertion_descr,1,0,WARN,_cVar7,(size_t)&local_230,0x331);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_1f0 + 0x10));
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x332;
  file_00.m_begin = (iterator)&local_240;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_250,
             msg_00);
  local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
  local_278._8_8_ = &PTR__lazy_ostream_013abb30;
  local_260 = boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_278._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result);
  local_1d0._0_8_ = local_278;
  local_1f8 = (undefined1  [8])&local_280;
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_278._0_8_ == 0x175a588b00);
  local_280 = 0x175a588b00;
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1a0 = (ArgsManager *)0xf800bd;
  local_1c0.data_ = (pointer)local_1d0;
  local_1c0._0_1_ = 0;
  local_1d0._8_8_ = &PTR__lazy_ostream_013abed0;
  local_1c0.n_ = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1d8 = local_1f8;
  local_1f0.m_message.px = (element_type *)((ulong)local_1f0.m_message.px & 0xffffffffffffff00);
  local_1f0._0_8_ = &PTR__lazy_ostream_013abed0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)(local_278 + 8),1,2,REQUIRE,0xf80e3f,(size_t)&local_1a8,
             0x332,assertion_descr,"1003 * COIN",&local_1f0);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x333;
  file_01.m_begin = (iterator)&local_290;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a0,
             msg_01);
  local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
  local_278._8_8_ = &PTR__lazy_ostream_013abb30;
  local_260 = boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  psVar3 = SelectionResult::GetInputSet((SelectionResult *)&result);
  local_278._0_8_ = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_278._0_8_ == 2);
  local_280 = CONCAT44(local_280._4_4_,2);
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1a0 = (ArgsManager *)0xf800bd;
  local_1d0._0_8_ = local_278;
  local_1c0._0_1_ = 0;
  local_1d0._8_8_ = &PTR__lazy_ostream_013abb70;
  local_1c0.n_ = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1c0.data_ = (pointer)local_1d0;
  local_1f8 = (undefined1  [8])&local_280;
  local_1f0.m_message.px = (element_type *)((ulong)local_1f0.m_message.px & 0xffffffffffffff00);
  local_1f0._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1d8 = local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)(local_278 + 8),1,2,REQUIRE,0xf80e66,(size_t)&local_1a8,
             0x333,assertion_descr,"2U",&local_1f0);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  if (result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
      super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
      super__Optional_payload_base<wallet::SelectionResult>._M_engaged == true) {
    result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_engaged = false;
    std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)&result);
  }
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  ChaCha20::~ChaCha20(&rand.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ApproximateBestSubset)
{
    FastRandomContext rand{};
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;

    // Test vValue sort order
    for (int i = 0; i < 1000; i++)
        add_coin(available_coins, *wallet, 1000 * COIN);
    add_coin(available_coins, *wallet, 3 * COIN);

    const auto result = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1003 * COIN, CENT, rand);
    BOOST_CHECK(result);
    BOOST_CHECK_EQUAL(result->GetSelectedValue(), 1003 * COIN);
    BOOST_CHECK_EQUAL(result->GetInputSet().size(), 2U);
}